

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Byte * tt_cmap14_find_variant(FT_Byte *base,FT_UInt32 variantCode)

{
  uint uVar1;
  uint uVar2;
  FT_ULong varSel;
  FT_Byte *p;
  uint local_28;
  FT_UInt32 mid;
  FT_UInt32 min;
  FT_UInt32 max;
  FT_UInt32 numVar;
  FT_UInt32 variantCode_local;
  FT_Byte *base_local;
  
  local_28 = 0;
  uVar1 = (uint)*base << 0x18 | (uint)base[1] << 0x10 | (uint)base[2] << 8 | (uint)base[3];
  while( true ) {
    do {
      mid = uVar1;
      if (mid <= local_28) {
        return (FT_Byte *)0x0;
      }
      uVar1 = local_28 + mid >> 1;
      uVar2 = (uint)base[(ulong)(uVar1 * 0xb) + 4] << 0x10 |
              (uint)base[(ulong)(uVar1 * 0xb) + 5] << 8 | (uint)base[(ulong)(uVar1 * 0xb) + 6];
    } while (variantCode < uVar2);
    if (variantCode <= uVar2) break;
    local_28 = uVar1 + 1;
    uVar1 = mid;
  }
  return base + (ulong)(uVar1 * 0xb) + 7;
}

Assistant:

static FT_Byte*
  tt_cmap14_find_variant( FT_Byte    *base,
                          FT_UInt32   variantCode )
  {
    FT_UInt32  numVar = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numVar;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid    = ( min + max ) >> 1;
      FT_Byte*   p      = base + 11 * mid;
      FT_ULong   varSel = TT_NEXT_UINT24( p );


      if ( variantCode < varSel )
        max = mid;
      else if ( variantCode > varSel )
        min = mid + 1;
      else
        return p;
    }

    return NULL;
  }